

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.h
# Opt level: O2

unique_ptr<BaseTest,_std::default_delete<BaseTest>_>
TestFactory::createTest<(TestFactory::Type)1,int>(int args)

{
  __uniq_ptr_data<BaseTest,_std::default_delete<BaseTest>,_true,_true> in_RDI;
  undefined8 *local_20 [2];
  
  *(undefined8 *)
   in_RDI.super___uniq_ptr_impl<BaseTest,_std::default_delete<BaseTest>_>._M_t.
   super__Tuple_impl<0UL,_BaseTest_*,_std::default_delete<BaseTest>_>.
   super__Head_base<0UL,_BaseTest_*,_false>._M_head_impl = 0;
  std::make_unique<DistinctIntTest,int>((int *)local_20);
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<BaseTest,_std::default_delete<BaseTest>_>._M_t.
   super__Tuple_impl<0UL,_BaseTest_*,_std::default_delete<BaseTest>_>.
   super__Head_base<0UL,_BaseTest_*,_false>._M_head_impl = local_20[0];
  (**(code **)*local_20[0])();
  return (__uniq_ptr_data<BaseTest,_std::default_delete<BaseTest>,_true,_true>)
         (tuple<BaseTest_*,_std::default_delete<BaseTest>_>)
         in_RDI.super___uniq_ptr_impl<BaseTest,_std::default_delete<BaseTest>_>._M_t.
         super__Tuple_impl<0UL,_BaseTest_*,_std::default_delete<BaseTest>_>.
         super__Head_base<0UL,_BaseTest_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<BaseTest>
	createTest(Args... args)
	{
		std::unique_ptr<BaseTest> ret;
		if constexpr (T == RandomDouble)
			ret = std::make_unique<RandomDoubleTest>(std::forward<Args>(args)...);
		else if constexpr (T == DistinctInt)
			ret = std::make_unique<DistinctIntTest>(std::forward<Args>(args)...);
		else if constexpr (T == Generator)
			ret = std::make_unique<GeneratorTest>(std::forward<Args>(args)...);
		ret->generate();
		return ret;
	}